

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

Vec_Int_t * Gia_ManProfileHash(Gia_Man_t *p,Vec_Int_t *vCode,Vec_Int_t *vCodeOffsets)

{
  uint p_00;
  int iVar1;
  int Entry;
  Vec_Int_t *p_01;
  Hsh_VecMan_t *p_02;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *p_03;
  
  p_01 = Vec_IntAlloc(p->nObjs);
  p_00 = p->nObjs;
  p_02 = (Hsh_VecMan_t *)calloc(1,0x48);
  iVar1 = Abc_PrimeCudd(p_00);
  pVVar2 = Vec_IntAlloc(iVar1);
  pVVar2->nSize = iVar1;
  if (pVVar2->pArray != (int *)0x0) {
    memset(pVVar2->pArray,0xff,(long)iVar1 << 2);
  }
  p_02->vTable = pVVar2;
  pVVar2 = Vec_IntAlloc(p_00 * 4);
  p_02->vData = pVVar2;
  pVVar2 = Vec_IntAlloc(p_00);
  p_02->vMap = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  Hsh_VecManAdd(p_02,pVVar2);
  for (iVar1 = 0; iVar1 < p->nObjs; iVar1 = iVar1 + 1) {
    p_03 = p;
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    Gia_ManProfileCollect(p_03,iVar1,vCode,vCodeOffsets,pVVar2);
    Entry = Hsh_VecManAdd(p_02,pVVar2);
    Vec_IntPush(p_01,Entry);
  }
  Vec_IntFree(p_02->vTable);
  Vec_IntFree(p_02->vData);
  Vec_IntFree(p_02->vMap);
  free(p_02);
  Vec_IntFree(pVVar2);
  if (p_01->nSize == p->nObjs) {
    return p_01;
  }
  __assert_fail("Vec_IntSize(vRes) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMuxes.c"
                ,0x354,"Vec_Int_t *Gia_ManProfileHash(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_ManProfileHash( Gia_Man_t * p, Vec_Int_t * vCode, Vec_Int_t * vCodeOffsets )
{
    Hsh_VecMan_t * pHash;
    Vec_Int_t * vRes, * vArray;
    Gia_Obj_t * pObj;
    int i;
    vRes = Vec_IntAlloc( Gia_ManObjNum(p) );
    pHash = Hsh_VecManStart( Gia_ManObjNum(p) );
    // add empty entry
    vArray = Vec_IntAlloc( 100 );
    Hsh_VecManAdd( pHash, vArray );
    // iterate through the entries
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ManProfileCollect( p, i, vCode, vCodeOffsets, vArray );
        Vec_IntPush( vRes, Hsh_VecManAdd( pHash, vArray ) );
    }
    Hsh_VecManStop( pHash );
    Vec_IntFree( vArray );
    assert( Vec_IntSize(vRes) == Gia_ManObjNum(p) );
    return vRes;
}